

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86.cpp
# Opt level: O0

void DoBlending_SSE2(PalEntry *from,PalEntry *to,int count,int r,int g,int b,int a)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  longlong color;
  size_t unaligned;
  __m128i color2;
  __m128i color1;
  __m128i blending256;
  __m128i zero;
  __m128i blendalpha;
  __m128i blendcolor;
  int b_local;
  int g_local;
  int r_local;
  int count_local;
  PalEntry *to_local;
  PalEntry *from_local;
  ushort uStack_2f6;
  ushort uStack_2f4;
  ushort uStack_2f2;
  ushort uStack_2f0;
  ushort uStack_2ee;
  ushort uStack_2ec;
  ushort uStack_2ea;
  ushort uStack_2d6;
  ushort uStack_2d4;
  ushort uStack_2d2;
  ushort uStack_2d0;
  ushort uStack_2ce;
  ushort uStack_2cc;
  ushort uStack_2ca;
  ushort uStack_2b6;
  ushort uStack_2b4;
  ushort uStack_2b2;
  ushort uStack_2b0;
  ushort uStack_2ae;
  ushort uStack_2ac;
  ushort uStack_2aa;
  ushort uStack_296;
  ushort uStack_294;
  ushort uStack_292;
  ushort uStack_290;
  ushort uStack_28e;
  ushort uStack_28c;
  ushort uStack_28a;
  short local_288;
  short sStack_286;
  short sStack_284;
  short sStack_282;
  short sStack_280;
  short sStack_27e;
  short sStack_27c;
  short sStack_27a;
  short local_278;
  short sStack_276;
  short sStack_274;
  short sStack_272;
  short local_268;
  short sStack_266;
  short sStack_264;
  short sStack_262;
  byte bStack_200;
  byte bStack_1ff;
  byte bStack_1fe;
  byte bStack_1fd;
  byte bStack_1fc;
  byte bStack_1fb;
  byte bStack_1fa;
  byte bStack_1f9;
  byte bStack_1e0;
  byte bStack_1df;
  byte bStack_1de;
  byte bStack_1dd;
  byte bStack_1dc;
  byte bStack_1db;
  byte bStack_1da;
  byte bStack_1d9;
  byte local_1c8;
  byte bStack_1c7;
  byte bStack_1c6;
  byte bStack_1c5;
  byte bStack_1c4;
  byte bStack_1c3;
  byte bStack_1c2;
  byte bStack_1c1;
  byte local_1a8;
  byte bStack_1a7;
  byte bStack_1a6;
  byte bStack_1a5;
  byte bStack_1a4;
  byte bStack_1a3;
  byte bStack_1a2;
  byte bStack_1a1;
  ushort local_108;
  ushort uStack_106;
  ushort uStack_104;
  ushort uStack_102;
  ushort uStack_100;
  ushort uStack_fe;
  ushort uStack_fc;
  ushort uStack_fa;
  ushort local_e8;
  ushort uStack_e6;
  ushort uStack_e4;
  ushort uStack_e2;
  ushort uStack_e0;
  ushort uStack_de;
  ushort uStack_dc;
  ushort uStack_da;
  ushort local_c8;
  ushort uStack_c6;
  ushort uStack_c4;
  ushort uStack_c2;
  ushort uStack_c0;
  ushort uStack_be;
  ushort uStack_bc;
  ushort uStack_ba;
  ushort local_a8;
  ushort uStack_a6;
  ushort uStack_a4;
  ushort uStack_a2;
  ushort uStack_a0;
  ushort uStack_9e;
  ushort uStack_9c;
  ushort uStack_9a;
  
  to_local._0_4_ = (uint)from;
  r_local = (int)to;
  uVar11 = (uint)to_local | r_local;
  uVar12 = (ulong)(uint)r << 0x20 | (long)(g << 0x10) | (long)b;
  uVar13 = (long)a << 0x20 | (long)(a << 0x10) | (long)a;
  local_268 = (short)b;
  sStack_266 = (short)(uVar12 >> 0x10);
  sStack_264 = (short)(uVar12 >> 0x20);
  sStack_262 = (short)(uVar12 >> 0x30);
  local_278 = (short)a;
  sStack_276 = (short)(uVar13 >> 0x10);
  sStack_274 = (short)(uVar13 >> 0x20);
  sStack_272 = (short)(uVar13 >> 0x30);
  blendalpha[1] =
       CONCAT26(sStack_262 * sStack_272,
                CONCAT24(sStack_264 * sStack_274,
                         CONCAT22(sStack_266 * sStack_276,local_268 * local_278)));
  blendcolor[0] =
       CONCAT26(sStack_262 * sStack_272,
                CONCAT24(sStack_264 * sStack_274,
                         CONCAT22(sStack_266 * sStack_276,local_268 * local_278)));
  auVar15._8_8_ = 0x10001000100;
  auVar15._0_8_ = 0x10001000100;
  auVar14._8_8_ = uVar13;
  auVar14._0_8_ = uVar13;
  auVar14 = psubusw(auVar15,auVar14);
  g_local = count >> 2;
  sStack_286 = auVar14._2_2_;
  sStack_284 = auVar14._4_2_;
  sStack_282 = auVar14._6_2_;
  sStack_27e = auVar14._10_2_;
  sStack_27c = auVar14._12_2_;
  sStack_27a = auVar14._14_2_;
  local_288 = auVar14._0_2_;
  sStack_280 = auVar14._8_2_;
  _r_local = to;
  to_local = from;
  if ((uVar11 & 0xf) == 0) {
    for (; 0 < g_local; g_local = g_local + -1) {
      uVar1 = *(undefined8 *)to_local;
      uVar2 = *(undefined8 *)(to_local + 2);
      to_local = to_local + 4;
      bStack_200 = (byte)uVar2;
      bStack_1ff = (byte)((ulong)uVar2 >> 8);
      bStack_1fe = (byte)((ulong)uVar2 >> 0x10);
      bStack_1fd = (byte)((ulong)uVar2 >> 0x18);
      bStack_1fc = (byte)((ulong)uVar2 >> 0x20);
      bStack_1fb = (byte)((ulong)uVar2 >> 0x28);
      bStack_1fa = (byte)((ulong)uVar2 >> 0x30);
      bStack_1f9 = (byte)((ulong)uVar2 >> 0x38);
      unaligned._0_2_ = (ushort)bStack_200;
      local_1c8 = (byte)uVar1;
      bStack_1c7 = (byte)((ulong)uVar1 >> 8);
      bStack_1c6 = (byte)((ulong)uVar1 >> 0x10);
      bStack_1c5 = (byte)((ulong)uVar1 >> 0x18);
      bStack_1c4 = (byte)((ulong)uVar1 >> 0x20);
      bStack_1c3 = (byte)((ulong)uVar1 >> 0x28);
      bStack_1c2 = (byte)((ulong)uVar1 >> 0x30);
      bStack_1c1 = (byte)((ulong)uVar1 >> 0x38);
      color2[1]._1_1_ = 0;
      color2[1]._0_1_ = local_1c8;
      uStack_2d6 = (ushort)bStack_1c7;
      uStack_2d4 = (ushort)bStack_1c6;
      uStack_2d2 = (ushort)bStack_1c5;
      uStack_2d0 = (ushort)bStack_1c4;
      uStack_2ce = (ushort)bStack_1c3;
      uStack_2cc = (ushort)bStack_1c2;
      uStack_2ca = (ushort)bStack_1c1;
      color2[1]._0_4_ = CONCAT22(sStack_286 * uStack_2d6,local_288 * (ushort)color2[1]);
      color2[1]._0_6_ = CONCAT24(sStack_284 * uStack_2d4,(undefined4)color2[1]);
      color2[1] = CONCAT26(sStack_282 * uStack_2d2,(undefined6)color2[1]);
      color1[0]._0_2_ = sStack_280 * uStack_2d0;
      color1[0]._2_2_ = sStack_27e * uStack_2ce;
      color1[0]._4_2_ = sStack_27c * uStack_2cc;
      color1[0]._6_2_ = sStack_27a * uStack_2ca;
      uStack_2f6 = (ushort)bStack_1ff;
      uStack_2f4 = (ushort)bStack_1fe;
      uStack_2f2 = (ushort)bStack_1fd;
      uStack_2f0 = (ushort)bStack_1fc;
      uStack_2ee = (ushort)bStack_1fb;
      uStack_2ec = (ushort)bStack_1fa;
      uStack_2ea = (ushort)bStack_1f9;
      unaligned._0_4_ = CONCAT22(sStack_286 * uStack_2f6,local_288 * (ushort)unaligned);
      unaligned._0_6_ = CONCAT24(sStack_284 * uStack_2f4,(undefined4)unaligned);
      unaligned = CONCAT26(sStack_282 * uStack_2f2,(undefined6)unaligned);
      color2[0]._0_2_ = sStack_280 * uStack_2f0;
      color2[0]._2_2_ = sStack_27e * uStack_2ee;
      color2[0]._4_2_ = sStack_27c * uStack_2ec;
      color2[0]._6_2_ = sStack_27a * uStack_2ea;
      auVar6._8_8_ = blendcolor[0];
      auVar6._0_8_ = blendalpha[1];
      auVar5._8_8_ = color1[0];
      auVar5._0_8_ = color2[1];
      auVar14 = paddusw(auVar6,auVar5);
      auVar4._8_8_ = blendcolor[0];
      auVar4._0_8_ = blendalpha[1];
      auVar3._8_8_ = color2[0];
      auVar3._0_8_ = unaligned;
      auVar15 = paddusw(auVar4,auVar3);
      local_e8 = auVar14._0_2_;
      uStack_e6 = auVar14._2_2_;
      uStack_e4 = auVar14._4_2_;
      uStack_e2 = auVar14._6_2_;
      uStack_e0 = auVar14._8_2_;
      uStack_de = auVar14._10_2_;
      uStack_dc = auVar14._12_2_;
      uStack_da = auVar14._14_2_;
      local_e8 = local_e8 >> 8;
      uStack_e6 = uStack_e6 >> 8;
      uStack_e4 = uStack_e4 >> 8;
      uStack_e2 = uStack_e2 >> 8;
      uStack_e0 = uStack_e0 >> 8;
      uStack_de = uStack_de >> 8;
      uStack_dc = uStack_dc >> 8;
      uStack_da = uStack_da >> 8;
      local_108 = auVar15._0_2_;
      uStack_106 = auVar15._2_2_;
      uStack_104 = auVar15._4_2_;
      uStack_102 = auVar15._6_2_;
      uStack_100 = auVar15._8_2_;
      uStack_fe = auVar15._10_2_;
      uStack_fc = auVar15._12_2_;
      uStack_fa = auVar15._14_2_;
      local_108 = local_108 >> 8;
      uStack_106 = uStack_106 >> 8;
      uStack_104 = uStack_104 >> 8;
      uStack_102 = uStack_102 >> 8;
      uStack_100 = uStack_100 >> 8;
      uStack_fe = uStack_fe >> 8;
      uStack_fc = uStack_fc >> 8;
      uStack_fa = uStack_fa >> 8;
      *(ulong *)_r_local =
           CONCAT17((uStack_da != 0) * (uStack_da < 0x100) * auVar14[0xf] - (0xff < uStack_da),
                    CONCAT16((uStack_dc != 0) * (uStack_dc < 0x100) * auVar14[0xd] -
                             (0xff < uStack_dc),
                             CONCAT15((uStack_de != 0) * (uStack_de < 0x100) * auVar14[0xb] -
                                      (0xff < uStack_de),
                                      CONCAT14((uStack_e0 != 0) * (uStack_e0 < 0x100) * auVar14[9] -
                                               (0xff < uStack_e0),
                                               CONCAT13((uStack_e2 != 0) * (uStack_e2 < 0x100) *
                                                        auVar14[7] - (0xff < uStack_e2),
                                                        CONCAT12((uStack_e4 != 0) *
                                                                 (uStack_e4 < 0x100) * auVar14[5] -
                                                                 (0xff < uStack_e4),
                                                                 CONCAT11((uStack_e6 != 0) *
                                                                          (uStack_e6 < 0x100) *
                                                                          auVar14[3] -
                                                                          (0xff < uStack_e6),
                                                                          (local_e8 != 0) *
                                                                          (local_e8 < 0x100) *
                                                                          auVar14[1] -
                                                                          (0xff < local_e8))))))));
      *(ulong *)(_r_local + 2) =
           CONCAT17((uStack_fa != 0) * (uStack_fa < 0x100) * auVar15[0xf] - (0xff < uStack_fa),
                    CONCAT16((uStack_fc != 0) * (uStack_fc < 0x100) * auVar15[0xd] -
                             (0xff < uStack_fc),
                             CONCAT15((uStack_fe != 0) * (uStack_fe < 0x100) * auVar15[0xb] -
                                      (0xff < uStack_fe),
                                      CONCAT14((uStack_100 != 0) * (uStack_100 < 0x100) * auVar15[9]
                                               - (0xff < uStack_100),
                                               CONCAT13((uStack_102 != 0) * (uStack_102 < 0x100) *
                                                        auVar15[7] - (0xff < uStack_102),
                                                        CONCAT12((uStack_104 != 0) *
                                                                 (uStack_104 < 0x100) * auVar15[5] -
                                                                 (0xff < uStack_104),
                                                                 CONCAT11((uStack_106 != 0) *
                                                                          (uStack_106 < 0x100) *
                                                                          auVar15[3] -
                                                                          (0xff < uStack_106),
                                                                          (local_108 != 0) *
                                                                          (local_108 < 0x100) *
                                                                          auVar15[1] -
                                                                          (0xff < local_108))))))));
      _r_local = _r_local + 4;
    }
  }
  else {
    for (; 0 < g_local; g_local = g_local + -1) {
      uVar1 = *(undefined8 *)to_local;
      uVar2 = *(undefined8 *)(to_local + 2);
      to_local = to_local + 4;
      bStack_1e0 = (byte)uVar2;
      bStack_1df = (byte)((ulong)uVar2 >> 8);
      bStack_1de = (byte)((ulong)uVar2 >> 0x10);
      bStack_1dd = (byte)((ulong)uVar2 >> 0x18);
      bStack_1dc = (byte)((ulong)uVar2 >> 0x20);
      bStack_1db = (byte)((ulong)uVar2 >> 0x28);
      bStack_1da = (byte)((ulong)uVar2 >> 0x30);
      bStack_1d9 = (byte)((ulong)uVar2 >> 0x38);
      unaligned._0_2_ = (ushort)bStack_1e0;
      local_1a8 = (byte)uVar1;
      bStack_1a7 = (byte)((ulong)uVar1 >> 8);
      bStack_1a6 = (byte)((ulong)uVar1 >> 0x10);
      bStack_1a5 = (byte)((ulong)uVar1 >> 0x18);
      bStack_1a4 = (byte)((ulong)uVar1 >> 0x20);
      bStack_1a3 = (byte)((ulong)uVar1 >> 0x28);
      bStack_1a2 = (byte)((ulong)uVar1 >> 0x30);
      bStack_1a1 = (byte)((ulong)uVar1 >> 0x38);
      color2[1]._1_1_ = 0;
      color2[1]._0_1_ = local_1a8;
      uStack_296 = (ushort)bStack_1a7;
      uStack_294 = (ushort)bStack_1a6;
      uStack_292 = (ushort)bStack_1a5;
      uStack_290 = (ushort)bStack_1a4;
      uStack_28e = (ushort)bStack_1a3;
      uStack_28c = (ushort)bStack_1a2;
      uStack_28a = (ushort)bStack_1a1;
      color2[1]._0_4_ = CONCAT22(sStack_286 * uStack_296,local_288 * (ushort)color2[1]);
      color2[1]._0_6_ = CONCAT24(sStack_284 * uStack_294,(undefined4)color2[1]);
      color2[1] = CONCAT26(sStack_282 * uStack_292,(undefined6)color2[1]);
      color1[0]._0_2_ = sStack_280 * uStack_290;
      color1[0]._2_2_ = sStack_27e * uStack_28e;
      color1[0]._4_2_ = sStack_27c * uStack_28c;
      color1[0]._6_2_ = sStack_27a * uStack_28a;
      uStack_2b6 = (ushort)bStack_1df;
      uStack_2b4 = (ushort)bStack_1de;
      uStack_2b2 = (ushort)bStack_1dd;
      uStack_2b0 = (ushort)bStack_1dc;
      uStack_2ae = (ushort)bStack_1db;
      uStack_2ac = (ushort)bStack_1da;
      uStack_2aa = (ushort)bStack_1d9;
      unaligned._0_4_ = CONCAT22(sStack_286 * uStack_2b6,local_288 * (ushort)unaligned);
      unaligned._0_6_ = CONCAT24(sStack_284 * uStack_2b4,(undefined4)unaligned);
      unaligned = CONCAT26(sStack_282 * uStack_2b2,(undefined6)unaligned);
      color2[0]._0_2_ = sStack_280 * uStack_2b0;
      color2[0]._2_2_ = sStack_27e * uStack_2ae;
      color2[0]._4_2_ = sStack_27c * uStack_2ac;
      color2[0]._6_2_ = sStack_27a * uStack_2aa;
      auVar10._8_8_ = blendcolor[0];
      auVar10._0_8_ = blendalpha[1];
      auVar9._8_8_ = color1[0];
      auVar9._0_8_ = color2[1];
      auVar14 = paddusw(auVar10,auVar9);
      auVar8._8_8_ = blendcolor[0];
      auVar8._0_8_ = blendalpha[1];
      auVar7._8_8_ = color2[0];
      auVar7._0_8_ = unaligned;
      auVar15 = paddusw(auVar8,auVar7);
      local_a8 = auVar14._0_2_;
      uStack_a6 = auVar14._2_2_;
      uStack_a4 = auVar14._4_2_;
      uStack_a2 = auVar14._6_2_;
      uStack_a0 = auVar14._8_2_;
      uStack_9e = auVar14._10_2_;
      uStack_9c = auVar14._12_2_;
      uStack_9a = auVar14._14_2_;
      local_a8 = local_a8 >> 8;
      uStack_a6 = uStack_a6 >> 8;
      uStack_a4 = uStack_a4 >> 8;
      uStack_a2 = uStack_a2 >> 8;
      uStack_a0 = uStack_a0 >> 8;
      uStack_9e = uStack_9e >> 8;
      uStack_9c = uStack_9c >> 8;
      uStack_9a = uStack_9a >> 8;
      local_c8 = auVar15._0_2_;
      uStack_c6 = auVar15._2_2_;
      uStack_c4 = auVar15._4_2_;
      uStack_c2 = auVar15._6_2_;
      uStack_c0 = auVar15._8_2_;
      uStack_be = auVar15._10_2_;
      uStack_bc = auVar15._12_2_;
      uStack_ba = auVar15._14_2_;
      local_c8 = local_c8 >> 8;
      uStack_c6 = uStack_c6 >> 8;
      uStack_c4 = uStack_c4 >> 8;
      uStack_c2 = uStack_c2 >> 8;
      uStack_c0 = uStack_c0 >> 8;
      uStack_be = uStack_be >> 8;
      uStack_bc = uStack_bc >> 8;
      uStack_ba = uStack_ba >> 8;
      *(ulong *)_r_local =
           CONCAT17((uStack_9a != 0) * (uStack_9a < 0x100) * auVar14[0xf] - (0xff < uStack_9a),
                    CONCAT16((uStack_9c != 0) * (uStack_9c < 0x100) * auVar14[0xd] -
                             (0xff < uStack_9c),
                             CONCAT15((uStack_9e != 0) * (uStack_9e < 0x100) * auVar14[0xb] -
                                      (0xff < uStack_9e),
                                      CONCAT14((uStack_a0 != 0) * (uStack_a0 < 0x100) * auVar14[9] -
                                               (0xff < uStack_a0),
                                               CONCAT13((uStack_a2 != 0) * (uStack_a2 < 0x100) *
                                                        auVar14[7] - (0xff < uStack_a2),
                                                        CONCAT12((uStack_a4 != 0) *
                                                                 (uStack_a4 < 0x100) * auVar14[5] -
                                                                 (0xff < uStack_a4),
                                                                 CONCAT11((uStack_a6 != 0) *
                                                                          (uStack_a6 < 0x100) *
                                                                          auVar14[3] -
                                                                          (0xff < uStack_a6),
                                                                          (local_a8 != 0) *
                                                                          (local_a8 < 0x100) *
                                                                          auVar14[1] -
                                                                          (0xff < local_a8))))))));
      *(ulong *)(_r_local + 2) =
           CONCAT17((uStack_ba != 0) * (uStack_ba < 0x100) * auVar15[0xf] - (0xff < uStack_ba),
                    CONCAT16((uStack_bc != 0) * (uStack_bc < 0x100) * auVar15[0xd] -
                             (0xff < uStack_bc),
                             CONCAT15((uStack_be != 0) * (uStack_be < 0x100) * auVar15[0xb] -
                                      (0xff < uStack_be),
                                      CONCAT14((uStack_c0 != 0) * (uStack_c0 < 0x100) * auVar15[9] -
                                               (0xff < uStack_c0),
                                               CONCAT13((uStack_c2 != 0) * (uStack_c2 < 0x100) *
                                                        auVar15[7] - (0xff < uStack_c2),
                                                        CONCAT12((uStack_c4 != 0) *
                                                                 (uStack_c4 < 0x100) * auVar15[5] -
                                                                 (0xff < uStack_c4),
                                                                 CONCAT11((uStack_c6 != 0) *
                                                                          (uStack_c6 < 0x100) *
                                                                          auVar15[3] -
                                                                          (0xff < uStack_c6),
                                                                          (local_c8 != 0) *
                                                                          (local_c8 < 0x100) *
                                                                          auVar15[1] -
                                                                          (0xff < local_c8))))))));
      _r_local = _r_local + 4;
    }
  }
  return;
}

Assistant:

void DoBlending_SSE2(const PalEntry *from, PalEntry *to, int count, int r, int g, int b, int a)
{
	__m128i blendcolor;
	__m128i blendalpha;
	__m128i zero;
	__m128i blending256;
	__m128i color1;
	__m128i color2;
	size_t unaligned;

	unaligned = ((size_t)from | (size_t)to) & 0xF;

#if defined(__amd64__) || defined(_M_X64)
	long long color;

	blending256 = _mm_set_epi64x(0x10001000100ll, 0x10001000100ll);

	color = ((long long)r << 32) | (g << 16) | b;
	blendcolor = _mm_set_epi64x(color, color);

	color = ((long long)a << 32) | (a << 16) | a;
	blendalpha = _mm_set_epi64x(color, color);
#else
	int color;

	blending256 = _mm_set_epi32(0x100, 0x1000100, 0x100, 0x1000100);

	color = (g << 16) | b;
	blendcolor = _mm_set_epi32(r, color, r, color);

	color = (a << 16) | a;
	blendalpha = _mm_set_epi32(a, color, a, color);
#endif

	blendcolor = _mm_mullo_epi16(blendcolor, blendalpha);	// premultiply blend by alpha
	blendalpha = _mm_subs_epu16(blending256, blendalpha);	// one minus alpha

	zero = _mm_setzero_si128();

	if (unaligned)
	{
		for (count >>= 2; count > 0; --count)
		{
			color1 = _mm_loadu_si128((__m128i *)from);
			from += 4;
			color2 = _mm_unpackhi_epi8(color1, zero);
			color1 = _mm_unpacklo_epi8(color1, zero);
			color1 = _mm_mullo_epi16(blendalpha, color1);
			color2 = _mm_mullo_epi16(blendalpha, color2);
			color1 = _mm_adds_epu16(blendcolor, color1);
			color2 = _mm_adds_epu16(blendcolor, color2);
			color1 = _mm_srli_epi16(color1, 8);
			color2 = _mm_srli_epi16(color2, 8);
			_mm_storeu_si128((__m128i *)to, _mm_packus_epi16(color1, color2));
			to += 4;
		}
	}
	else
	{
		for (count >>= 2; count > 0; --count)
		{
			color1 = _mm_load_si128((__m128i *)from);
			from += 4;
			color2 = _mm_unpackhi_epi8(color1, zero);
			color1 = _mm_unpacklo_epi8(color1, zero);
			color1 = _mm_mullo_epi16(blendalpha, color1);
			color2 = _mm_mullo_epi16(blendalpha, color2);
			color1 = _mm_adds_epu16(blendcolor, color1);
			color2 = _mm_adds_epu16(blendcolor, color2);
			color1 = _mm_srli_epi16(color1, 8);
			color2 = _mm_srli_epi16(color2, 8);
			_mm_store_si128((__m128i *)to, _mm_packus_epi16(color1, color2));
			to += 4;
		}
	}
}